

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.hpp
# Opt level: O0

void de::cmdline::detail::dispatchSetDefault<de::cmdline::TestNamedOpt>(TypedFieldMap *dst)

{
  unsigned_long *dst_00;
  ValueType *value;
  TypedFieldMap *dst_local;
  
  dst_00 = (unsigned_long *)operator_new(8);
  *dst_00 = 0;
  getTypeDefault<unsigned_long>(dst_00);
  TypedFieldMap::set<de::cmdline::TestNamedOpt>(dst,dst_00);
  return;
}

Assistant:

void dispatchSetDefault (TypedFieldMap* dst)
{
	typename OptTraits<OptType>::ValueType* value = new typename OptTraits<OptType>::ValueType();
	try
	{
		getTypeDefault<typename OptTraits<OptType>::ValueType>(value);
		dst->set<OptType>(value);
	}
	catch (...)
	{
		delete value;
		throw;
	}
}